

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int untrap_prob(trap *ttmp)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = 0x1e;
  if (youmonst.data == mons + 100) {
    iVar4 = 3;
  }
  if (youmonst.data == mons + 0x62) {
    iVar4 = 3;
  }
  if ((ttmp->field_0x8 & 0x1f) != 0x13) {
    iVar4 = 3;
  }
  if ((u.uprops[0x1c].intrinsic != 0) ||
     (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
      ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))))) {
    iVar4 = iVar4 + 1;
  }
  if (((u.uprops[0x1e].intrinsic != 0) ||
      (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
     ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
    iVar4 = iVar4 + 1;
  }
  if (((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c'))
  {
    iVar4 = iVar4 + 2;
  }
  iVar4 = (int)((char)ttmp->field_0x8 >> 7) +
          (iVar4 << (u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0));
  if (urole.malenum == 0x164) {
    uVar3 = mt_random();
    iVar4 = iVar4 - (uint)((int)(uVar3 % 0x3c) < u.ulevel);
    bVar1 = (bool)((u.uhave._0_1_ & 0x10) >> 4);
  }
  else {
    bVar1 = urole.malenum == 0x163;
  }
  uVar3 = mt_random();
  return SUB164(ZEXT416(uVar3) % SEXT816((long)(int)(iVar4 - (uint)(byte)(1 < iVar4 & bVar1))),0);
}

Assistant:

static int untrap_prob(struct trap *ttmp)
{
	int chance = 3;

	/* Only spiders know how to deal with webs reliably */
	if (ttmp->ttyp == WEB && !webmaker(youmonst.data))
	 	chance = 30;
	if (Confusion || Hallucination) chance++;
	if (Blind) chance++;
	if (Stunned) chance += 2;
	if (Fumbling) chance *= 2;
	/* Your own traps are better known than others. */
	if (ttmp->madeby_u) chance--;
	if (Role_if (PM_ROGUE)) {
	    if (rn2(2 * MAXULEV) < u.ulevel) chance--;
	    if (u.uhave.questart && chance > 1) chance--;
	} else if (Role_if (PM_RANGER) && chance > 1) chance--;
	return rn2(chance);
}